

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O3

int VP8LCreateCompressedHuffmanTree(HuffmanTreeCode *tree,HuffmanTreeToken *tokens,int max_tokens)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  char cVar5;
  uint uVar6;
  size_t __n;
  uint8_t uVar7;
  HuffmanTreeToken *__s;
  uint8_t uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  HuffmanTreeToken *pHVar13;
  
  iVar2 = tree->num_symbols;
  __s = tokens;
  if (0 < (long)iVar2) {
    iVar10 = 0;
    uVar8 = '\b';
    do {
      lVar9 = (long)iVar10;
      uVar7 = tree->code_lengths[lVar9];
      iVar11 = iVar10;
      iVar4 = iVar10 + 1;
      if (iVar10 + 1 < iVar2) {
        iVar4 = iVar2;
      }
      do {
        lVar9 = lVar9 + 1;
        iVar12 = iVar4;
        if (iVar2 <= lVar9) break;
        iVar12 = iVar11 + 1;
        iVar11 = iVar12;
      } while (tree->code_lengths[lVar9] == uVar7);
      uVar6 = iVar12 - iVar10;
      if (uVar7 == '\0') {
        uVar7 = uVar8;
        if (0 < (int)uVar6) {
          uVar1 = uVar6 - 1;
          pHVar13 = __s + (ulong)uVar1 + 1;
          __n = (size_t)(uint)((iVar12 * 2 - iVar10) - iVar10);
          uVar8 = ((char)iVar12 - (char)iVar10) + 0xfd;
          do {
            if (uVar6 < 3) {
              memset(__s,0,__n);
              __s = pHVar13;
              break;
            }
            if (uVar6 < 0xb) {
              __s->code = '\x11';
              __s->extra_bits = uVar8;
LAB_00140a59:
              __s = __s + 1;
              break;
            }
            __s->code = '\x12';
            if (uVar6 < 0x8b) {
              __s->extra_bits = (char)uVar1 + (char)(uVar1 / 0x8a) * 'v' + 0xf6;
              goto LAB_00140a59;
            }
            __s->extra_bits = '\x7f';
            __s = __s + 1;
            pHVar13 = pHVar13 + -0x89;
            __n = __n - 0x114;
            uVar8 = uVar8 + 'v';
            bVar3 = 0x8a < (int)uVar6;
            uVar6 = uVar6 - 0x8a;
          } while (bVar3);
        }
      }
      else {
        if (uVar8 != uVar7) {
          __s->code = uVar7;
          __s->extra_bits = '\0';
          __s = __s + 1;
          uVar6 = uVar6 - 1;
        }
        if (0 < (int)uVar6) {
          if (2 < uVar6) {
            uVar1 = uVar6 - 1;
            cVar5 = (char)uVar6;
            do {
              __s->code = '\x10';
              if (uVar6 < 7) {
                __s->extra_bits = (char)(uVar1 / 6) * -6 + cVar5 + 0xfd;
                __s = __s + 1;
                goto LAB_00140a60;
              }
              __s->extra_bits = '\x03';
              __s = __s + 1;
              uVar6 = uVar6 - 6;
            } while (2 < uVar6);
          }
          do {
            __s->code = uVar7;
            __s->extra_bits = '\0';
            __s = __s + 1;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
      }
LAB_00140a60:
      iVar10 = iVar12;
      uVar8 = uVar7;
    } while (iVar12 < iVar2);
  }
  return (int)((ulong)((long)__s - (long)tokens) >> 1);
}

Assistant:

int VP8LCreateCompressedHuffmanTree(const HuffmanTreeCode* const tree,
                                    HuffmanTreeToken* tokens, int max_tokens) {
  HuffmanTreeToken* const starting_token = tokens;
  HuffmanTreeToken* const ending_token = tokens + max_tokens;
  const int depth_size = tree->num_symbols;
  int prev_value = 8;  // 8 is the initial value for rle.
  int i = 0;
  assert(tokens != NULL);
  while (i < depth_size) {
    const int value = tree->code_lengths[i];
    int k = i + 1;
    int runs;
    while (k < depth_size && tree->code_lengths[k] == value) ++k;
    runs = k - i;
    if (value == 0) {
      tokens = CodeRepeatedZeros(runs, tokens);
    } else {
      tokens = CodeRepeatedValues(runs, tokens, value, prev_value);
      prev_value = value;
    }
    i += runs;
    assert(tokens <= ending_token);
  }
  (void)ending_token;    // suppress 'unused variable' warning
  return (int)(tokens - starting_token);
}